

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O1

void h264_print_pred_weight_table(h264_slice *slice,h264_pred_weight_table *table)

{
  int32_t *piVar1;
  ulong uVar2;
  
  printf("\tluma_log2_weight_denom = %d\n",(ulong)table->luma_log2_weight_denom);
  printf("\tchroma_log2_weight_denom = %d\n",(ulong)table->chroma_log2_weight_denom);
  piVar1 = table->l0[0].chroma_offset + 1;
  uVar2 = 0xffffffffffffffff;
  do {
    uVar2 = uVar2 + 1;
    printf("\tluma_weight_l0_flag[%d] = %d\n",uVar2 & 0xffffffff,
           (ulong)((h264_pred_weight_table_entry *)(piVar1 + -7))->luma_weight_flag);
    printf("\tluma_weight_l0[%d] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-6]);
    printf("\tluma_offset_l0[%d] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-5]);
    printf("\tchroma_weight_l0_flag[%d] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-4]);
    printf("\tchroma_weight_l0[%d][0] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-3]);
    printf("\tchroma_weight_l0[%d][1] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-2]);
    printf("\tchroma_offset_l0[%d][0] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-1]);
    printf("\tchroma_offset_l0[%d][1] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)*piVar1);
    piVar1 = piVar1 + 8;
  } while (uVar2 < slice->num_ref_idx_l0_active_minus1);
  if (slice->slice_type == 1) {
    piVar1 = table->l1[0].chroma_offset + 1;
    uVar2 = 0xffffffffffffffff;
    do {
      uVar2 = uVar2 + 1;
      printf("\tluma_weight_l1_flag[%d] = %d\n",uVar2 & 0xffffffff,
             (ulong)((h264_pred_weight_table_entry *)(piVar1 + -7))->luma_weight_flag);
      printf("\tluma_weight_l1[%d] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-6]);
      printf("\tluma_offset_l1[%d] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-5]);
      printf("\tchroma_weight_l1_flag[%d] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-4]);
      printf("\tchroma_weight_l1[%d][0] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-3]);
      printf("\tchroma_weight_l1[%d][1] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-2]);
      printf("\tchroma_offset_l1[%d][0] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[-1]);
      printf("\tchroma_offset_l1[%d][1] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)*piVar1);
      piVar1 = piVar1 + 8;
    } while (uVar2 < slice->num_ref_idx_l1_active_minus1);
  }
  return;
}

Assistant:

void h264_print_pred_weight_table(struct h264_slice *slice, struct h264_pred_weight_table *table) {
	printf("\tluma_log2_weight_denom = %d\n", table->luma_log2_weight_denom);
	printf("\tchroma_log2_weight_denom = %d\n", table->chroma_log2_weight_denom);
	int i;
	for (i = 0; i <= slice->num_ref_idx_l0_active_minus1; i++) {
		printf("\tluma_weight_l0_flag[%d] = %d\n", i, table->l0[i].luma_weight_flag);
		printf("\tluma_weight_l0[%d] = %d\n", i, table->l0[i].luma_weight);
		printf("\tluma_offset_l0[%d] = %d\n", i, table->l0[i].luma_offset);
		printf("\tchroma_weight_l0_flag[%d] = %d\n", i, table->l0[i].chroma_weight_flag);
		printf("\tchroma_weight_l0[%d][0] = %d\n", i, table->l0[i].chroma_weight[0]);
		printf("\tchroma_weight_l0[%d][1] = %d\n", i, table->l0[i].chroma_weight[1]);
		printf("\tchroma_offset_l0[%d][0] = %d\n", i, table->l0[i].chroma_offset[0]);
		printf("\tchroma_offset_l0[%d][1] = %d\n", i, table->l0[i].chroma_offset[1]);
	}
	if (slice->slice_type == H264_SLICE_TYPE_B) {
		for (i = 0; i <= slice->num_ref_idx_l1_active_minus1; i++) {
			printf("\tluma_weight_l1_flag[%d] = %d\n", i, table->l1[i].luma_weight_flag);
			printf("\tluma_weight_l1[%d] = %d\n", i, table->l1[i].luma_weight);
			printf("\tluma_offset_l1[%d] = %d\n", i, table->l1[i].luma_offset);
			printf("\tchroma_weight_l1_flag[%d] = %d\n", i, table->l1[i].chroma_weight_flag);
			printf("\tchroma_weight_l1[%d][0] = %d\n", i, table->l1[i].chroma_weight[0]);
			printf("\tchroma_weight_l1[%d][1] = %d\n", i, table->l1[i].chroma_weight[1]);
			printf("\tchroma_offset_l1[%d][0] = %d\n", i, table->l1[i].chroma_offset[0]);
			printf("\tchroma_offset_l1[%d][1] = %d\n", i, table->l1[i].chroma_offset[1]);
		}
	}
}